

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

optional<pbrt::ShapeSample> * __thiscall
pbrt::BilinearPatch::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,BilinearPatch *this,
          ShapeSampleContext *ctx,Point2f u)

{
  Point3f *pPVar1;
  Point3f *pPVar2;
  Point3f *pPVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  int iVar42;
  int iVar43;
  BilinearPatchMesh *mesh;
  int *piVar44;
  Point3f *pPVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  ulong uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  byte bVar61;
  anon_struct_8_0_00000001_for___align aVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  bool bVar65;
  long lVar66;
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar75 [48];
  undefined1 auVar71 [64];
  undefined1 auVar73 [64];
  float fVar76;
  float fVar81;
  undefined8 in_XMM0_Qb;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  Float FVar77;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar78;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar79;
  float fVar80;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar109 [56];
  undefined1 auVar108 [64];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar110;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar144;
  Vector3f a;
  Point3f PVar145;
  Vector3f b;
  Vector3f c;
  Vector3f d;
  Float quadPDF;
  optional<pbrt::ShapeSample> ss;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_188 [16];
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  float local_dc;
  undefined1 local_d8 [16];
  aligned_storage_t<sizeof(pbrt::ShapeSample),_alignof(pbrt::ShapeSample)> local_c8;
  bool local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  Tuple3<pbrt::Vector3,_float> local_50;
  Tuple3<pbrt::Vector3,_float> local_40;
  undefined1 auVar72 [64];
  undefined1 auVar74 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  
  mesh = *(BilinearPatchMesh **)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar66 = (long)this->blpIndex;
  piVar44 = mesh->vertexIndices;
  iVar41 = piVar44[lVar66 * 4];
  pPVar45 = mesh->p;
  pPVar1 = pPVar45 + piVar44[lVar66 * 4 + 1];
  iVar42 = piVar44[lVar66 * 4 + 2];
  iVar43 = piVar44[lVar66 * 4 + 3];
  auVar67._0_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar67._4_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar67._8_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar67._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  uVar18 = *(undefined8 *)
            &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
  auVar67 = vinsertps_avx(auVar67,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  auVar68._0_4_ = (float)uVar18 + auVar67._0_4_;
  auVar68._4_4_ = (float)((ulong)uVar18 >> 0x20) + auVar67._4_4_;
  auVar68._8_4_ = auVar67._8_4_ + 0.0;
  auVar68._12_4_ = auVar67._12_4_ + 0.0;
  auVar70._8_4_ = 0xbf000000;
  auVar70._0_8_ = 0xbf000000bf000000;
  auVar70._12_4_ = 0xbf000000;
  auVar75 = in_ZmmResult._16_48_;
  auVar67 = vmulps_avx512vl(auVar68,auVar70);
  uVar4 = pPVar45[iVar41].super_Tuple3<pbrt::Point3,_float>.x;
  uVar19 = pPVar45[iVar41].super_Tuple3<pbrt::Point3,_float>.y;
  local_1d8._0_4_ = (float)uVar4 + auVar67._0_4_;
  local_1d8._4_4_ = (float)uVar19 + auVar67._4_4_;
  fStack_1d0 = auVar67._8_4_ + 0.0;
  fStack_1cc = auVar67._12_4_ + 0.0;
  auVar69._0_4_ = (float)local_1d8._0_4_ * (float)local_1d8._0_4_;
  auVar69._4_4_ = (float)local_1d8._4_4_ * (float)local_1d8._4_4_;
  auVar69._8_4_ = fStack_1d0 * fStack_1d0;
  auVar69._12_4_ = fStack_1cc * fStack_1cc;
  auVar67 = vhaddps_avx(auVar69,auVar69);
  fVar78 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
           + (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
             high) * -0.5 + pPVar45[iVar41].super_Tuple3<pbrt::Point3,_float>.z;
  fVar81 = auVar67._0_4_ + fVar78 * fVar78;
  local_188._8_8_ = in_XMM0_Qb;
  local_188._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  if (fVar81 < 0.0) {
    fVar81 = sqrtf(fVar81);
  }
  else {
    auVar67 = vsqrtss_avx(ZEXT416((uint)fVar81),ZEXT416((uint)fVar81));
    fVar81 = auVar67._0_4_;
  }
  pPVar2 = pPVar45 + iVar42;
  auVar49._0_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar49._4_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar49._8_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar49._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  fVar110 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
            + (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
              high) * -0.5 + (pPVar1->super_Tuple3<pbrt::Point3,_float>).z;
  uVar18 = *(undefined8 *)
            &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
  auVar67 = vinsertps_avx(auVar49,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  auVar100._0_4_ = (float)uVar18 + auVar67._0_4_;
  auVar100._4_4_ = (float)((ulong)uVar18 >> 0x20) + auVar67._4_4_;
  auVar100._8_4_ = auVar67._8_4_ + 0.0;
  auVar100._12_4_ = auVar67._12_4_ + 0.0;
  auVar121._8_4_ = 0xbf000000;
  auVar121._0_8_ = 0xbf000000bf000000;
  auVar121._12_4_ = 0xbf000000;
  auVar67 = vmulps_avx512vl(auVar100,auVar121);
  uVar5 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  uVar20 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  local_178._0_4_ = (float)uVar5 + auVar67._0_4_;
  local_178._4_4_ = (float)uVar20 + auVar67._4_4_;
  fStack_170 = auVar67._8_4_ + 0.0;
  fStack_16c = auVar67._12_4_ + 0.0;
  auVar82._0_4_ = (float)local_178._0_4_ * (float)local_178._0_4_;
  auVar82._4_4_ = (float)local_178._4_4_ * (float)local_178._4_4_;
  auVar82._8_4_ = fStack_170 * fStack_170;
  auVar82._12_4_ = fStack_16c * fStack_16c;
  auVar67 = vhaddps_avx(auVar82,auVar82);
  fVar79 = auVar67._0_4_ + fVar110 * fVar110;
  if (fVar79 < 0.0) {
    fVar79 = sqrtf(fVar79);
  }
  else {
    auVar67 = vsqrtss_avx(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79));
    fVar79 = auVar67._0_4_;
  }
  pPVar3 = pPVar45 + iVar43;
  auVar33._0_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar33._4_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar33._8_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar33._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  uVar18 = *(undefined8 *)
            &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
  auVar67 = vinsertps_avx(auVar33,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  auVar83._0_4_ = (float)uVar18 + auVar67._0_4_;
  auVar83._4_4_ = (float)((ulong)uVar18 >> 0x20) + auVar67._4_4_;
  auVar83._8_4_ = auVar67._8_4_ + 0.0;
  auVar83._12_4_ = auVar67._12_4_ + 0.0;
  auVar51._8_4_ = 0xbf000000;
  auVar51._0_8_ = 0xbf000000bf000000;
  auVar51._12_4_ = 0xbf000000;
  auVar67 = vmulps_avx512vl(auVar83,auVar51);
  uVar6 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).x;
  uVar21 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).y;
  local_148._0_4_ = (float)uVar6 + auVar67._0_4_;
  local_148._4_4_ = (float)uVar21 + auVar67._4_4_;
  fStack_140 = auVar67._8_4_ + 0.0;
  fStack_13c = auVar67._12_4_ + 0.0;
  auVar84._0_4_ = (float)local_148._0_4_ * (float)local_148._0_4_;
  auVar84._4_4_ = (float)local_148._4_4_ * (float)local_148._4_4_;
  auVar84._8_4_ = fStack_140 * fStack_140;
  auVar84._12_4_ = fStack_13c * fStack_13c;
  auVar67 = vhaddps_avx(auVar84,auVar84);
  fVar144 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
            + (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
              high) * -0.5 + (pPVar2->super_Tuple3<pbrt::Point3,_float>).z;
  fVar76 = auVar67._0_4_ + fVar144 * fVar144;
  if (fVar76 < 0.0) {
    fVar76 = sqrtf(fVar76);
  }
  else {
    auVar67 = vsqrtss_avx(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76));
    fVar76 = auVar67._0_4_;
  }
  auVar34._0_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar34._4_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar34._8_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar34._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  fVar80 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
           + (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
             high) * -0.5 + (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
  uVar18 = *(undefined8 *)
            &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
  auVar67 = vinsertps_avx(auVar34,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  auVar85._0_4_ = (float)uVar18 + auVar67._0_4_;
  auVar85._4_4_ = (float)((ulong)uVar18 >> 0x20) + auVar67._4_4_;
  auVar85._8_4_ = auVar67._8_4_ + 0.0;
  auVar85._12_4_ = auVar67._12_4_ + 0.0;
  auVar52._8_4_ = 0xbf000000;
  auVar52._0_8_ = 0xbf000000bf000000;
  auVar52._12_4_ = 0xbf000000;
  auVar67 = vmulps_avx512vl(auVar85,auVar52);
  uVar7 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
  uVar22 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
  local_68 = (float)uVar7 + auVar67._0_4_;
  fStack_64 = (float)uVar22 + auVar67._4_4_;
  fStack_60 = auVar67._8_4_ + 0.0;
  fStack_5c = auVar67._12_4_ + 0.0;
  auVar86._0_4_ = local_68 * local_68;
  auVar86._4_4_ = fStack_64 * fStack_64;
  auVar86._8_4_ = fStack_60 * fStack_60;
  auVar86._12_4_ = fStack_5c * fStack_5c;
  auVar67 = vhaddps_avx(auVar86,auVar86);
  fVar46 = auVar67._0_4_ + fVar80 * fVar80;
  if (fVar46 < 0.0) {
    auVar103._0_4_ = sqrtf(fVar46);
    auVar103._4_60_ = extraout_var;
    local_d8 = auVar103._0_16_;
  }
  else {
    local_d8 = vsqrtss_avx(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
  }
  bVar65 = IsRectangle(this,mesh);
  if ((bVar65) && (mesh->imageDistribution == (PiecewiseConstant2D *)0x0)) {
    auVar87._4_4_ = fVar81;
    auVar87._0_4_ = fVar81;
    auVar87._8_4_ = fVar81;
    auVar87._12_4_ = fVar81;
    auVar124._4_4_ = fVar79;
    auVar124._0_4_ = fVar79;
    auVar124._8_4_ = fVar79;
    auVar124._12_4_ = fVar79;
    auVar133._4_4_ = fVar76;
    auVar133._0_4_ = fVar76;
    auVar133._8_4_ = fVar76;
    auVar133._12_4_ = fVar76;
    auVar67 = vdivps_avx(_local_1d8,auVar87);
    a.super_Tuple3<pbrt::Vector3,_float>.z = fVar78 / fVar81;
    auVar70 = vdivps_avx(_local_178,auVar124);
    b.super_Tuple3<pbrt::Vector3,_float>.z = fVar110 / fVar79;
    auVar68 = vdivps_avx(_local_148,auVar133);
    d.super_Tuple3<pbrt::Vector3,_float>.z = fVar144 / fVar76;
    auVar134._4_4_ = local_d8._0_4_;
    auVar134._0_4_ = local_d8._0_4_;
    auVar134._8_4_ = local_d8._0_4_;
    auVar134._12_4_ = local_d8._0_4_;
    auVar64._4_4_ = fStack_64;
    auVar64._0_4_ = local_68;
    auVar64._8_4_ = fStack_60;
    auVar64._12_4_ = fStack_5c;
    auVar69 = vdivps_avx(auVar64,auVar134);
    c.super_Tuple3<pbrt::Vector3,_float>.z = fVar80 / (float)local_d8._0_4_;
    a.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar67._0_8_;
    b.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar70._0_8_;
    c.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar69._0_8_;
    d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar68._0_8_;
    FVar77 = SphericalQuadArea(a,b,c,d);
    if (0.0001 < FVar77) {
      pPVar45 = pPVar45 + iVar41;
      if (((((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
           (fVar78 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y, fVar78 != 0.0)) ||
          (NAN(fVar78))) ||
         ((fVar78 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z, fVar78 != 0.0 || (NAN(fVar78))))
         ) {
        auVar37._0_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low
        ;
        auVar37._4_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
        auVar37._8_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
        ;
        auVar37._12_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
             high;
        fVar81 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  z.low + (ctx->pi).super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
        uVar18 = *(undefined8 *)
                  &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.high;
        auVar67 = vinsertps_avx(auVar37,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                      high),0x10);
        auVar90._0_4_ = (float)uVar18 + auVar67._0_4_;
        auVar90._4_4_ = (float)((ulong)uVar18 >> 0x20) + auVar67._4_4_;
        auVar90._8_4_ = auVar67._8_4_ + 0.0;
        auVar90._12_4_ = auVar67._12_4_ + 0.0;
        auVar54._8_4_ = 0x3f000000;
        auVar54._0_8_ = 0x3f0000003f000000;
        auVar54._12_4_ = 0x3f000000;
        auVar68 = vmulps_avx512vl(auVar90,auVar54);
        uVar8 = (pPVar45->super_Tuple3<pbrt::Point3,_float>).x;
        uVar23 = (pPVar45->super_Tuple3<pbrt::Point3,_float>).y;
        auVar91._4_4_ = uVar23;
        auVar91._0_4_ = uVar8;
        auVar91._8_8_ = 0;
        auVar70 = vsubps_avx(auVar91,auVar68);
        auVar92._0_4_ = auVar70._0_4_ * auVar70._0_4_;
        auVar92._4_4_ = auVar70._4_4_ * auVar70._4_4_;
        auVar92._8_4_ = auVar70._8_4_ * auVar70._8_4_;
        auVar92._12_4_ = auVar70._12_4_ * auVar70._12_4_;
        auVar67 = vhaddps_avx(auVar92,auVar92);
        fVar110 = (pPVar45->super_Tuple3<pbrt::Point3,_float>).z - fVar81;
        fVar78 = auVar67._0_4_ + fVar110 * fVar110;
        if (fVar78 < 0.0) {
          auVar104._0_4_ = sqrtf(fVar78);
          auVar104._4_60_ = extraout_var_00;
          auVar67 = auVar104._0_16_;
        }
        else {
          auVar67 = vsqrtss_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
        }
        auVar38._0_12_ = *(undefined1 (*) [12])&ctx->ns;
        auVar38._12_4_ = ctx->time;
        fVar78 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
        fVar79 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
        uVar9 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
        uVar24 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
        auVar114._4_4_ = uVar24;
        auVar114._0_4_ = uVar9;
        auVar114._8_8_ = 0;
        auVar49 = vsubps_avx(auVar114,auVar68);
        auVar115._0_4_ = auVar49._0_4_ * auVar49._0_4_;
        auVar115._4_4_ = auVar49._4_4_ * auVar49._4_4_;
        auVar115._8_4_ = auVar49._8_4_ * auVar49._8_4_;
        auVar115._12_4_ = auVar49._12_4_ * auVar49._12_4_;
        auVar69 = vhaddps_avx(auVar115,auVar115);
        fVar76 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).z - fVar81;
        fVar144 = auVar69._0_4_ + fVar76 * fVar76;
        if (fVar144 < 0.0) {
          auVar105._0_4_ = sqrtf(fVar144);
          auVar105._4_60_ = extraout_var_01;
          auVar69 = auVar105._0_16_;
        }
        else {
          auVar69 = vsqrtss_avx(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144));
        }
        auVar69 = vinsertps_avx(auVar67,auVar69,0x10);
        auVar67 = vinsertps_avx(auVar70,auVar49,0x1c);
        auVar67 = vdivps_avx(auVar67,auVar69);
        auVar70 = vpermi2ps_avx512vl(_DAT_003d1540,auVar70,auVar49);
        auVar70 = vdivps_avx(auVar70,auVar69);
        auVar49 = vinsertps_avx(ZEXT416((uint)fVar110),ZEXT416((uint)fVar76),0x10);
        auVar69 = vdivps_avx(auVar49,auVar69);
        auVar49 = vinsertps_avx(ZEXT416((uint)fVar79),
                                ZEXT416((uint)(ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z),0x10);
        auVar136._0_4_ = auVar69._0_4_ * auVar49._0_4_;
        auVar136._4_4_ = auVar69._4_4_ * auVar49._4_4_;
        auVar136._8_4_ = auVar69._8_4_ * auVar49._8_4_;
        auVar136._12_4_ = auVar69._12_4_ * auVar49._12_4_;
        auVar121 = vinsertps_avx(ZEXT416((uint)fVar78),
                                 ZEXT416((uint)(ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y),0x10)
        ;
        auVar70 = vfmadd213ps_fma(auVar121,auVar70,auVar136);
        auVar69 = vfmsub213ps_fma(auVar69,auVar49,auVar136);
        auVar93._0_4_ = auVar70._0_4_ + auVar69._0_4_;
        auVar93._4_4_ = auVar70._4_4_ + auVar69._4_4_;
        auVar93._8_4_ = auVar70._8_4_ + auVar69._8_4_;
        auVar93._12_4_ = auVar70._12_4_ + auVar69._12_4_;
        auVar70 = vinsertps_avx(auVar38,ZEXT416((uint)(ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x
                                               ),0x10);
        auVar67 = vfmadd213ps_fma(auVar70,auVar67,auVar93);
        auVar55._8_4_ = 0x7fffffff;
        auVar55._0_8_ = 0x7fffffff7fffffff;
        auVar55._12_4_ = 0x7fffffff;
        auVar67 = vandps_avx512vl(auVar67,auVar55);
        auVar56._8_4_ = 0x3c23d70a;
        auVar56._0_8_ = 0x3c23d70a3c23d70a;
        auVar56._12_4_ = 0x3c23d70a;
        auVar69 = vmaxps_avx512vl(auVar67,auVar56);
        uVar10 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).x;
        uVar25 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).y;
        auVar94._4_4_ = uVar25;
        auVar94._0_4_ = uVar10;
        auVar94._8_8_ = 0;
        auVar70 = vsubps_avx(auVar94,auVar68);
        auVar95._0_4_ = auVar70._0_4_ * auVar70._0_4_;
        auVar95._4_4_ = auVar70._4_4_ * auVar70._4_4_;
        auVar95._8_4_ = auVar70._8_4_ * auVar70._8_4_;
        auVar95._12_4_ = auVar70._12_4_ * auVar70._12_4_;
        auVar67 = vhaddps_avx(auVar95,auVar95);
        fVar110 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).z - fVar81;
        fVar78 = auVar67._0_4_ + fVar110 * fVar110;
        if (fVar78 < 0.0) {
          auVar106._0_4_ = sqrtf(fVar78);
          auVar106._4_60_ = extraout_var_02;
          auVar67 = auVar106._0_16_;
        }
        else {
          auVar67 = vsqrtss_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
        }
        fVar78 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x;
        fVar79 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
        fVar144 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
        uVar11 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
        uVar26 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
        auVar116._4_4_ = uVar26;
        auVar116._0_4_ = uVar11;
        auVar116._8_8_ = 0;
        auVar49 = vsubps_avx(auVar116,auVar68);
        auVar117._0_4_ = auVar49._0_4_ * auVar49._0_4_;
        auVar117._4_4_ = auVar49._4_4_ * auVar49._4_4_;
        auVar117._8_4_ = auVar49._8_4_ * auVar49._8_4_;
        auVar117._12_4_ = auVar49._12_4_ * auVar49._12_4_;
        auVar68 = vhaddps_avx(auVar117,auVar117);
        fVar81 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z - fVar81;
        fVar76 = auVar68._0_4_ + fVar81 * fVar81;
        if (fVar76 < 0.0) {
          auVar107._0_4_ = sqrtf(fVar76);
          auVar107._4_60_ = extraout_var_03;
          auVar68 = auVar107._0_16_;
        }
        else {
          auVar68 = vsqrtss_avx(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76));
        }
        auVar82 = ZEXT816(0) << 0x40;
        auVar68 = vinsertps_avx(auVar68,auVar67,0x10);
        auVar67 = vinsertps_avx(auVar49,auVar70,0x1c);
        auVar67 = vdivps_avx(auVar67,auVar68);
        auVar70 = vinsertps_avx(auVar70,auVar49,0x4c);
        auVar70 = vdivps_avx(auVar70,auVar68);
        auVar49 = vinsertps_avx(ZEXT416((uint)fVar81),ZEXT416((uint)fVar110),0x10);
        auVar68 = vdivps_avx(auVar49,auVar68);
        auVar39._0_12_ = *(undefined1 (*) [12])&ctx->ns;
        auVar39._12_4_ = ctx->time;
        auVar49 = vinsertps_avx(auVar39,ZEXT416((uint)fVar78),0x10);
        auVar121 = vinsertps_avx(ZEXT416((uint)(ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z),
                                 ZEXT416((uint)fVar144),0x10);
        auVar140._0_4_ = auVar68._0_4_ * auVar121._0_4_;
        auVar140._4_4_ = auVar68._4_4_ * auVar121._4_4_;
        auVar140._8_4_ = auVar68._8_4_ * auVar121._8_4_;
        auVar140._12_4_ = auVar68._12_4_ * auVar121._12_4_;
        auVar100 = vinsertps_avx(ZEXT416((uint)(ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y),
                                 ZEXT416((uint)fVar79),0x10);
        auVar70 = vfmadd213ps_fma(auVar100,auVar70,auVar140);
        auVar68 = vfmsub213ps_fma(auVar68,auVar121,auVar140);
        auVar96._0_4_ = auVar70._0_4_ + auVar68._0_4_;
        auVar96._4_4_ = auVar70._4_4_ + auVar68._4_4_;
        auVar96._8_4_ = auVar70._8_4_ + auVar68._8_4_;
        auVar96._12_4_ = auVar70._12_4_ + auVar68._12_4_;
        auVar67 = vfmadd231ps_fma(auVar96,auVar67,auVar49);
        auVar57._8_4_ = 0x7fffffff;
        auVar57._0_8_ = 0x7fffffff7fffffff;
        auVar57._12_4_ = 0x7fffffff;
        auVar70 = vandps_avx512vl(auVar67,auVar57);
        auVar58._8_4_ = 0x3c23d70a;
        auVar58._0_8_ = 0x3c23d70a3c23d70a;
        auVar58._12_4_ = 0x3c23d70a;
        uVar50 = vcmpps_avx512vl(auVar70,auVar58,0xe);
        bVar61 = (byte)(uVar50 >> 1);
        auVar67 = vshufps_avx(auVar70,auVar70,0xf5);
        auVar72._16_48_ = auVar75;
        auVar72._0_16_ = SUB6416(ZEXT464(0x3c23d70a),0);
        auVar71._4_60_ = auVar72._4_60_;
        auVar71._0_4_ =
             (float)((uint)(bVar61 & 1) * auVar67._0_4_ + (uint)!(bool)(bVar61 & 1) * 0x3c23d70a);
        auVar74._16_48_ = auVar75;
        auVar74._0_16_ = SUB6416(ZEXT464(0x3c23d70a),0);
        auVar73._4_60_ = auVar74._4_60_;
        auVar73._0_4_ =
             (float)((uint)((byte)uVar50 & 1) * auVar70._0_4_ +
                    (uint)!(bool)((byte)uVar50 & 1) * 0x3c23d70a);
        auVar67 = vmovshdup_avx(local_188);
        auVar70 = vmovshdup_avx(auVar69);
        fVar78 = auVar70._0_4_ + auVar69._0_4_;
        fVar81 = auVar67._0_4_;
        if (((fVar81 != 0.0) || (NAN(fVar81))) || ((fVar78 != 0.0 || (NAN(fVar78))))) {
          fVar110 = auVar71._0_4_ + auVar73._0_4_;
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar81 * fVar110 * fVar110)),
                                    ZEXT416((uint)(fVar78 * fVar78)),ZEXT416((uint)(1.0 - fVar81)));
          if (auVar67._0_4_ < 0.0) {
            fVar79 = sqrtf(auVar67._0_4_);
          }
          else {
            auVar67 = vsqrtss_avx(auVar67,auVar67);
            fVar79 = auVar67._0_4_;
          }
          auVar82 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                               ZEXT416((uint)((fVar81 * (fVar78 + fVar110)) / (fVar78 + fVar79))));
        }
        fVar144 = auVar82._0_4_;
        fVar81 = 1.0 - fVar144;
        auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * fVar144)),ZEXT416((uint)fVar81),
                                  auVar69);
        auVar67 = ZEXT816(0) << 0x20;
        fVar110 = u.super_Tuple2<pbrt::Point2,_float>.x;
        fVar79 = auVar68._0_4_;
        if ((((fVar110 != 0.0) || (NAN(fVar110))) || (fVar79 != 0.0)) || (NAN(fVar79))) {
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * fVar144)),ZEXT416((uint)fVar81),
                                    auVar70);
          fVar76 = auVar67._0_4_;
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar110 * fVar76 * fVar76)),
                                    ZEXT416((uint)(fVar79 * fVar79)),ZEXT416((uint)(1.0 - fVar110)))
          ;
          if (auVar67._0_4_ < 0.0) {
            fVar80 = sqrtf(auVar67._0_4_);
          }
          else {
            auVar67 = vsqrtss_avx(auVar67,auVar67);
            fVar80 = auVar67._0_4_;
          }
          auVar67 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                               ZEXT416((uint)((fVar110 * (fVar79 + fVar76)) / (fVar79 + fVar80))));
        }
        local_188 = vinsertps_avx(auVar67,auVar82,0x10);
        fVar110 = auVar67._0_4_;
        if (((fVar110 < 0.0) || (1.0 < fVar110)) || ((fVar144 < 0.0 || (1.0 < fVar144)))) {
          local_1d8._0_4_ = 0.0;
        }
        else {
          local_1d8._0_4_ = auVar73._0_4_ + fVar78 + auVar71._0_4_;
          if (((float)local_1d8._0_4_ != 0.0) || (NAN((float)local_1d8._0_4_))) {
            auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar70._0_4_ * fVar81 * fVar110)),auVar69,
                                      ZEXT416((uint)(fVar81 * (1.0 - fVar110))));
            auVar67 = vfmadd213ss_fma(auVar71._0_16_,ZEXT416((uint)(fVar144 * (1.0 - fVar110))),
                                      auVar67);
            auVar67 = vfmadd213ss_fma(auVar73._0_16_,ZEXT416((uint)(fVar144 * fVar110)),auVar67);
            local_1d8._0_4_ = (auVar67._0_4_ * 4.0) / (float)local_1d8._0_4_;
          }
          else {
            local_1d8._0_4_ = 1.0;
          }
        }
      }
      else {
        local_1d8._0_4_ = 1.0;
      }
      auVar40._0_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar40._4_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar40._8_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar40._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      uVar18 = *(undefined8 *)
                &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x
                 .high;
      auVar67 = vinsertps_avx(auVar40,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                    high),0x10);
      auVar97._0_4_ = (float)uVar18 + auVar67._0_4_;
      auVar97._4_4_ = (float)((ulong)uVar18 >> 0x20) + auVar67._4_4_;
      auVar97._8_4_ = auVar67._8_4_ + 0.0;
      auVar97._12_4_ = auVar67._12_4_ + 0.0;
      auVar53._8_4_ = 0x3f000000;
      auVar53._0_8_ = 0x3f0000003f000000;
      auVar53._12_4_ = 0x3f000000;
      auVar67 = vmulps_avx512vl(auVar97,auVar53);
      local_c8._8_4_ =
           ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
           + (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
             high) * 0.5;
      uVar18 = vmovlps_avx(auVar67);
      local_c8._0_4_ = (undefined4)uVar18;
      local_c8._4_4_ = (undefined4)((ulong)uVar18 >> 0x20);
      uVar12 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
      uVar27 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
      auVar98._4_4_ = uVar27;
      auVar98._0_4_ = uVar12;
      auVar98._8_8_ = 0;
      uVar13 = (pPVar45->super_Tuple3<pbrt::Point3,_float>).x;
      uVar28 = (pPVar45->super_Tuple3<pbrt::Point3,_float>).y;
      auVar118._4_4_ = uVar28;
      auVar118._0_4_ = uVar13;
      auVar118._8_8_ = 0;
      auVar67 = vsubps_avx(auVar98,auVar118);
      local_40.z = (pPVar1->super_Tuple3<pbrt::Point3,_float>).z -
                   (pPVar45->super_Tuple3<pbrt::Point3,_float>).z;
      local_40._0_8_ = vmovlps_avx(auVar67);
      uVar14 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).x;
      uVar29 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).y;
      auVar99._4_4_ = uVar29;
      auVar99._0_4_ = uVar14;
      auVar99._8_8_ = 0;
      uVar15 = (pPVar45->super_Tuple3<pbrt::Point3,_float>).x;
      uVar30 = (pPVar45->super_Tuple3<pbrt::Point3,_float>).y;
      auVar119._4_4_ = uVar30;
      auVar119._0_4_ = uVar15;
      auVar119._8_8_ = 0;
      auVar67 = vsubps_avx(auVar99,auVar119);
      local_50.z = (pPVar2->super_Tuple3<pbrt::Point3,_float>).z -
                   (pPVar45->super_Tuple3<pbrt::Point3,_float>).z;
      local_50._0_8_ = vmovlps_avx(auVar67);
      auVar109 = ZEXT856(local_188._8_8_);
      PVar145 = SampleSphericalRectangle
                          ((Point3f *)&local_c8.__align,pPVar45,(Vector3f *)&local_40,
                           (Vector3f *)&local_50,(Point2f)local_188._0_8_,&local_dc);
      fVar110 = PVar145.super_Tuple3<pbrt::Point3,_float>.z;
      auVar108._0_8_ = PVar145.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar108._8_56_ = auVar109;
      auVar100 = auVar108._0_16_;
      uVar16 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
      uVar31 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).z;
      auVar101._4_4_ = uVar31;
      auVar101._0_4_ = uVar16;
      auVar101._8_8_ = 0;
      uVar17 = (pPVar45->super_Tuple3<pbrt::Point3,_float>).y;
      uVar32 = (pPVar45->super_Tuple3<pbrt::Point3,_float>).z;
      auVar120._4_4_ = uVar32;
      auVar120._0_4_ = uVar17;
      auVar120._8_8_ = 0;
      auVar69 = vsubps_avx(auVar101,auVar120);
      auVar67 = vinsertps_avx(ZEXT416((uint)(pPVar2->super_Tuple3<pbrt::Point3,_float>).y),
                              ZEXT416((uint)(pPVar1->super_Tuple3<pbrt::Point3,_float>).x),0x10);
      auVar68 = ZEXT416((uint)(pPVar45->super_Tuple3<pbrt::Point3,_float>).x);
      auVar70 = vinsertps_avx(auVar120,auVar68,0x10);
      auVar49 = vsubps_avx(auVar67,auVar70);
      auVar67 = vinsertps_avx(ZEXT416((uint)(pPVar2->super_Tuple3<pbrt::Point3,_float>).z),
                              ZEXT416((uint)(pPVar2->super_Tuple3<pbrt::Point3,_float>).x),0x10);
      auVar70 = vpermi2ps_avx512vl(_DAT_003d14a0,auVar120,auVar68);
      auVar70 = vsubps_avx(auVar67,auVar70);
      auVar67 = vpermi2ps_avx512vl(_DAT_003d14b0,auVar70,auVar69);
      auVar130._0_4_ = auVar49._0_4_ * auVar67._0_4_;
      auVar130._4_4_ = auVar49._4_4_ * auVar67._4_4_;
      auVar130._8_4_ = auVar49._8_4_ * auVar67._8_4_;
      auVar130._12_4_ = auVar49._12_4_ * auVar67._12_4_;
      auVar67 = vinsertps_avx(auVar49,auVar70,0x1c);
      auVar68 = vmovshdup_avx(auVar70);
      auVar121 = vfmsub213ps_fma(auVar70,auVar69,auVar130);
      auVar70 = vinsertps_avx(auVar49,auVar69,0x4c);
      auVar67 = vfnmadd213ps_fma(auVar67,auVar70,auVar130);
      auVar137._0_4_ = auVar121._0_4_ + auVar67._0_4_;
      auVar137._4_4_ = auVar121._4_4_ + auVar67._4_4_;
      auVar137._8_4_ = auVar121._8_4_ + auVar67._8_4_;
      auVar137._12_4_ = auVar121._12_4_ + auVar67._12_4_;
      auVar67 = vmovshdup_avx(auVar49);
      auVar121 = ZEXT416((uint)(auVar69._0_4_ * auVar68._0_4_));
      auVar70 = vfmsub213ss_fma(auVar67,auVar49,auVar121);
      auVar68 = vfnmadd213ss_fma(auVar68,auVar69,auVar121);
      auVar102._0_4_ = auVar137._0_4_ * auVar137._0_4_;
      auVar102._4_4_ = auVar137._4_4_ * auVar137._4_4_;
      auVar102._8_4_ = auVar137._8_4_ * auVar137._8_4_;
      auVar102._12_4_ = auVar137._12_4_ * auVar137._12_4_;
      auVar67 = vhaddps_avx(auVar102,auVar102);
      fVar78 = auVar70._0_4_ + auVar68._0_4_;
      fVar81 = fVar78 * fVar78 + auVar67._0_4_;
      if (fVar81 < 0.0) {
        fVar81 = sqrtf(fVar81);
      }
      else {
        auVar67 = vsqrtss_avx(ZEXT416((uint)fVar81),ZEXT416((uint)fVar81));
        fVar81 = auVar67._0_4_;
      }
      auVar122._4_4_ = fVar81;
      auVar122._0_4_ = fVar81;
      auVar122._8_4_ = fVar81;
      auVar122._12_4_ = fVar81;
      auVar67 = vdivps_avx(auVar137,auVar122);
      bVar65 = mesh->reverseOrientation == mesh->transformSwapsHandedness;
      auVar123 = auVar67;
      if (!bVar65) {
        auVar123._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
        auVar123._8_4_ = auVar67._8_4_ ^ 0x80000000;
        auVar123._12_4_ = auVar67._12_4_ ^ 0x80000000;
      }
      fVar79 = (pPVar45->super_Tuple3<pbrt::Point3,_float>).x;
      auVar126._4_4_ = fVar79;
      auVar126._0_4_ = fVar79;
      auVar126._8_4_ = fVar79;
      auVar126._12_4_ = fVar79;
      fVar79 = PVar145.super_Tuple3<pbrt::Point3,_float>.x - fVar79;
      auVar67 = vmovshdup_avx(auVar100);
      fVar144 = (pPVar45->super_Tuple3<pbrt::Point3,_float>).y;
      auVar141._4_4_ = fVar144;
      auVar141._0_4_ = fVar144;
      auVar141._8_4_ = fVar144;
      auVar141._12_4_ = fVar144;
      fVar144 = auVar67._0_4_ - fVar144;
      fVar76 = (pPVar45->super_Tuple3<pbrt::Point3,_float>).z;
      auVar143._4_4_ = fVar76;
      auVar143._0_4_ = fVar76;
      auVar143._8_4_ = fVar76;
      auVar143._12_4_ = fVar76;
      fVar76 = fVar110 - fVar76;
      auVar67 = vinsertps_avx(ZEXT416((uint)(pPVar1->super_Tuple3<pbrt::Point3,_float>).x),
                              ZEXT416((uint)(pPVar2->super_Tuple3<pbrt::Point3,_float>).x),0x10);
      auVar70 = vsubps_avx(auVar67,auVar126);
      auVar67 = vinsertps_avx(ZEXT416((uint)(pPVar1->super_Tuple3<pbrt::Point3,_float>).y),
                              ZEXT416((uint)(pPVar2->super_Tuple3<pbrt::Point3,_float>).y),0x10);
      auVar68 = vsubps_avx(auVar67,auVar141);
      auVar67 = vinsertps_avx(ZEXT416((uint)(pPVar1->super_Tuple3<pbrt::Point3,_float>).z),
                              ZEXT416((uint)(pPVar2->super_Tuple3<pbrt::Point3,_float>).z),0x10);
      auVar67 = vsubps_avx(auVar67,auVar143);
      fVar80 = auVar68._0_4_;
      auVar138._0_4_ = fVar144 * fVar80;
      fVar46 = auVar68._4_4_;
      auVar138._4_4_ = fVar144 * fVar46;
      fVar47 = auVar68._8_4_;
      auVar138._8_4_ = fVar144 * fVar47;
      fVar48 = auVar68._12_4_;
      auVar138._12_4_ = fVar144 * fVar48;
      auVar131._4_4_ = fVar79;
      auVar131._0_4_ = fVar79;
      auVar131._8_4_ = fVar79;
      auVar131._12_4_ = fVar79;
      auVar68 = vfmadd213ps_fma(auVar131,auVar70,auVar138);
      auVar139._4_4_ = fVar76;
      auVar139._0_4_ = fVar76;
      auVar139._8_4_ = fVar76;
      auVar139._12_4_ = fVar76;
      auVar68 = vfmadd213ps_fma(auVar139,auVar67,auVar68);
      auVar127._0_4_ =
           auVar70._0_4_ * auVar70._0_4_ + fVar80 * fVar80 + auVar67._0_4_ * auVar67._0_4_;
      auVar127._4_4_ =
           auVar70._4_4_ * auVar70._4_4_ + fVar46 * fVar46 + auVar67._4_4_ * auVar67._4_4_;
      auVar127._8_4_ =
           auVar70._8_4_ * auVar70._8_4_ + fVar47 * fVar47 + auVar67._8_4_ * auVar67._8_4_;
      auVar127._12_4_ =
           auVar70._12_4_ * auVar70._12_4_ + fVar48 * fVar48 + auVar67._12_4_ * auVar67._12_4_;
      auVar67 = vdivps_avx(auVar68,auVar127);
      auVar132._4_4_ = fVar110;
      auVar132._0_4_ = fVar110;
      auVar132._8_4_ = fVar110;
      auVar132._12_4_ = fVar110;
      FVar77 = ctx->time;
      __return_storage_ptr__->set = true;
      auVar70 = vshufps_avx(auVar100,auVar100,0x50);
      *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar70;
      uVar18 = vmovlps_avx(auVar132);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar18;
      *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = FVar77;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = 0;
      uVar18 = vmovlps_avx(auVar123);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar18;
      *(uint *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
           (uint)bVar65 * (int)(fVar78 / fVar81) + (uint)!bVar65 * (int)-(fVar78 / fVar81);
      uVar18 = vmovlps_avx(auVar67);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = uVar18;
      *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x3c) =
           ZEXT816(0) << 0x20;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x4c) = 0;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
           (float)local_1d8._0_4_ * local_dc;
      return __return_storage_ptr__;
    }
  }
  Sample((optional<pbrt::ShapeSample> *)&local_c8.__align,this,u);
  if (local_70 != false) {
    local_c8._24_4_ = ctx->time;
    auVar63._4_4_ = local_c8._4_4_;
    auVar63._0_4_ = local_c8._0_4_;
    auVar63._8_4_ = local_c8._8_4_;
    auVar63._12_4_ = local_c8._12_4_;
    auVar67 = vinsertps_avx(auVar63,ZEXT416((uint)local_c8._12_4_),0x10);
    auVar142._0_4_ = ((float)local_c8._4_4_ + auVar67._0_4_) * 0.5;
    auVar142._4_4_ = ((float)local_c8._8_4_ + auVar67._4_4_) * 0.5;
    auVar142._8_4_ = (auVar67._8_4_ + 0.0) * 0.5;
    auVar142._12_4_ = (auVar67._12_4_ + 0.0) * 0.5;
    fVar79 = ((float)local_c8._16_4_ + (float)local_c8._20_4_) * 0.5;
    auVar35._0_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    auVar35._4_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    auVar35._8_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
    auVar35._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
    fVar144 = auVar142._0_4_ -
              ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
               low + (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) * 0.5;
    uVar18 = *(undefined8 *)
              &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
               high;
    auVar67 = vinsertps_avx(auVar35,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high)
                            ,0x10);
    auVar88._0_4_ = ((float)uVar18 + auVar67._0_4_) * 0.5;
    auVar88._4_4_ = ((float)((ulong)uVar18 >> 0x20) + auVar67._4_4_) * 0.5;
    auVar88._8_4_ = (auVar67._8_4_ + 0.0) * 0.5;
    auVar88._12_4_ = (auVar67._12_4_ + 0.0) * 0.5;
    auVar67 = vpermi2ps_avx512vl(_DAT_003d14a0,auVar142,ZEXT416((uint)fVar79));
    auVar70 = vsubps_avx(auVar67,auVar88);
    auVar111._0_4_ = auVar70._0_4_ * auVar70._0_4_;
    auVar111._4_4_ = auVar70._4_4_ * auVar70._4_4_;
    fVar81 = auVar70._8_4_;
    auVar111._8_4_ = fVar81 * fVar81;
    fVar110 = auVar70._12_4_;
    auVar111._12_4_ = fVar110 * fVar110;
    auVar67 = vmovshdup_avx(auVar111);
    fVar78 = fVar144 * fVar144 + auVar111._0_4_ + auVar67._0_4_;
    if ((fVar78 != 0.0) || (NAN(fVar78))) {
      if (fVar78 < 0.0) {
        fVar78 = sqrtf(fVar78);
      }
      else {
        auVar67 = vsqrtss_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
        fVar78 = auVar67._0_4_;
      }
      auVar128._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
      auVar128._8_4_ = -fVar81;
      auVar128._12_4_ = -fVar110;
      auVar89._4_4_ = fVar78;
      auVar89._0_4_ = fVar78;
      auVar89._8_4_ = fVar78;
      auVar89._12_4_ = fVar78;
      auVar67 = vdivps_avx(auVar128,auVar89);
      auVar129._4_4_ = local_c8._48_4_;
      auVar129._0_4_ = local_c8._44_4_;
      auVar129._8_8_ = 0;
      auVar135._0_4_ = auVar67._0_4_ * (float)local_c8._44_4_;
      auVar135._4_4_ = auVar67._4_4_ * (float)local_c8._48_4_;
      auVar135._8_4_ = auVar67._8_4_ * 0.0;
      auVar135._12_4_ = auVar67._12_4_ * 0.0;
      uVar50 = CONCAT44(auVar135._4_4_,auVar135._0_4_);
      auVar125._0_8_ = uVar50 ^ 0x8000000080000000;
      auVar125._8_4_ = -auVar135._8_4_;
      auVar125._12_4_ = -auVar135._12_4_;
      auVar70 = vpermi2ps_avx512vl(_DAT_003d1540,auVar135,auVar125);
      auVar67 = vfmadd231ps_fma(auVar70,auVar129,auVar67);
      auVar67 = vhaddps_avx(auVar67,auVar67);
      auVar67 = vfnmadd231ss_fma(auVar67,ZEXT416((uint)(fVar144 / fVar78)),
                                 ZEXT416((uint)local_c8._40_4_));
      auVar59._8_4_ = 0x7fffffff;
      auVar59._0_8_ = 0x7fffffff7fffffff;
      auVar59._12_4_ = 0x7fffffff;
      auVar70 = vandps_avx512vl(auVar67,auVar59);
      auVar36._0_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar36._4_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar36._8_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar36._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      fVar79 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                low + (ctx->pi).super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 - fVar79;
      uVar18 = *(undefined8 *)
                &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x
                 .high;
      auVar67 = vinsertps_avx(auVar36,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                    high),0x10);
      auVar112._0_4_ = (float)uVar18 + auVar67._0_4_;
      auVar112._4_4_ = (float)((ulong)uVar18 >> 0x20) + auVar67._4_4_;
      auVar112._8_4_ = auVar67._8_4_ + 0.0;
      auVar112._12_4_ = auVar67._12_4_ + 0.0;
      auVar60._8_4_ = 0x3f000000;
      auVar60._0_8_ = 0x3f0000003f000000;
      auVar60._12_4_ = 0x3f000000;
      auVar67 = vmulps_avx512vl(auVar112,auVar60);
      auVar67 = vsubps_avx(auVar67,auVar142);
      auVar113._0_4_ = auVar67._0_4_ * auVar67._0_4_;
      auVar113._4_4_ = auVar67._4_4_ * auVar67._4_4_;
      auVar113._8_4_ = auVar67._8_4_ * auVar67._8_4_;
      auVar113._12_4_ = auVar67._12_4_ * auVar67._12_4_;
      auVar67 = vhaddps_avx(auVar113,auVar113);
      fVar78 = (float)local_c8._80_4_ / (auVar70._0_4_ / (auVar67._0_4_ + fVar79 * fVar79));
      if (ABS(fVar78) != INFINITY) {
        __return_storage_ptr__->set = local_70;
        aVar62._4_4_ = local_c8._4_4_;
        aVar62._0_4_ = local_c8._0_4_;
        (__return_storage_ptr__->optionalValue).__align = aVar62;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
             CONCAT44(local_c8._12_4_,local_c8._8_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
             CONCAT44(local_c8._20_4_,local_c8._16_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
             CONCAT44(local_c8._28_4_,local_c8._24_4_);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_c8._32_8_;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
             CONCAT44(local_c8._44_4_,local_c8._40_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
             CONCAT44(local_c8._52_4_,local_c8._48_4_);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = local_c8._56_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_c8._64_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_c8._72_8_;
        *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = fVar78;
        return __return_storage_ptr__;
      }
    }
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[4]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
             ,0xea,"Check failed: %s",(char (*) [4])0x2c8dc3c);
}

Assistant:

pstd::optional<ShapeSample> BilinearPatch::Sample(const ShapeSampleContext &ctx,
                                                  Point2f u) const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Find normalized vectors to corners of bilinear patch
    Vector3f v00 = Normalize(p00 - ctx.p()), v10 = Normalize(p10 - ctx.p());
    Vector3f v01 = Normalize(p01 - ctx.p()), v11 = Normalize(p11 - ctx.p());

    if (IsRectangle(mesh) && !mesh->imageDistribution &&
        SphericalQuadArea(v00, v10, v11, v01) > MinSphericalSampleArea) {
        // Sample direction to rectanglular bilinear patch
        Float pdf = 1;
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Warp uniform sample _u_ to account for incident $\cos \theta$ factor
            // Compute $\cos \theta$ weights for rectangle seen from _ctx.p()_
            Point3f rp = ctx.p();
            pstd::array<Float, 4> w = pstd::array<Float, 4>{
                std::max<Float>(0.01, AbsDot(Normalize(p00 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p10 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p01 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p11 - rp), ctx.ns))};

            u = SampleBilinear(u, w);
            pdf *= BilinearPDF(u, w);
        }
        // Sample spherical rectangle at reference point $\pt{}$
        Float quadPDF;
        Point3f p =
            SampleSphericalRectangle(ctx.p(), p00, p10 - p00, p01 - p00, u, &quadPDF);
        pdf *= quadPDF;

        // Compute surface normal and $(u,v)$ for sampled point on rectangle
        Normal3f n = Normal3f(Normalize(Cross(p10 - p00, p01 - p00)));
        if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;
        Point2f uv(Dot(p - p00, p10 - p00) / DistanceSquared(p10, p00),
                   Dot(p - p00, p01 - p00) / DistanceSquared(p01, p00));

        return ShapeSample{Interaction(p, n, ctx.time, uv), pdf};

    } else {
        // Uniformly sample shape and compute incident direction _wi_
        pstd::optional<ShapeSample> ss = Sample(u);
        DCHECK(ss.has_value());
        ss->intr.time = ctx.time;
        Vector3f wi = ss->intr.p() - ctx.p();
        if (LengthSquared(wi) == 0)
            return {};
        wi = Normalize(wi);

        // Convert uniform area sample PDF in _ss_ to solid angle measure
        ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
        if (IsInf(ss->pdf))
            return {};

        return ss;
    }
}